

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedDestructor.hpp
# Opt level: O0

void __thiscall
gmlc::concurrency::DelayedDestructor<helics::Broker>::DelayedDestructor
          (DelayedDestructor<helics::Broker> *this,
          function<void_(std::shared_ptr<helics::Broker>_&)> *callFirst)

{
  long in_RDI;
  function<void_(std::shared_ptr<helics::Broker>_&)> *this_00;
  TripWireDetector *this_01;
  function<void_(std::shared_ptr<helics::Broker>_&)> *in_stack_ffffffffffffffb8;
  
  std::timed_mutex::timed_mutex((timed_mutex *)0x50ae52);
  this_00 = (function<void_(std::shared_ptr<helics::Broker>_&)> *)(in_RDI + 0x28);
  std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>::
  vector((vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
          *)0x50ae65);
  this_01 = (TripWireDetector *)(in_RDI + 0x40);
  std::function<void_(std::shared_ptr<helics::Broker>_&)>::function
            (this_00,in_stack_ffffffffffffffb8);
  TripWireDetector::TripWireDetector(this_01);
  return;
}

Assistant:

explicit DelayedDestructor(
        std::function<void(std::shared_ptr<X>& ptr)> callFirst):
        callBeforeDeleteFunction(std::move(callFirst))
    {
    }